

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockBuilderSetNodePos(ImGuiID node_id,ImVec2 pos)

{
  ImGuiDockNode *pIVar1;
  ImGuiDockNode *node;
  ImGuiContext *ctx;
  ImGuiID node_id_local;
  ImVec2 pos_local;
  
  pIVar1 = DockContextFindNodeByID(GImGui,node_id);
  if (pIVar1 != (ImGuiDockNode *)0x0) {
    pIVar1->Pos = pos;
    *(ushort *)&pIVar1->field_0xbc = *(ushort *)&pIVar1->field_0xbc & 0xfff8 | 1;
  }
  return;
}

Assistant:

void ImGui::DockBuilderSetNodePos(ImGuiID node_id, ImVec2 pos)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockNode* node = DockContextFindNodeByID(ctx, node_id);
    if (node == NULL)
        return;
    node->Pos = pos;
    node->AuthorityForPos = ImGuiDataAuthority_DockNode;
}